

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O0

void __thiscall QAccessibleDial::QAccessibleDial(QAccessibleDial *this,QWidget *widget)

{
  long lVar1;
  QLatin1StringView latin1;
  QAccessibleAbstractSlider *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  char *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0 [16];
  QString *signal;
  QAccessibleWidget *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  signal = in_RDI;
  QAccessibleAbstractSlider::QAccessibleAbstractSlider
            (in_RSI,in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._4_4_);
  (in_RDI->d).d = (Data *)&PTR__QAccessibleDial_00d29f78;
  (in_RDI->d).size = (qsizetype)&PTR__QAccessibleDial_00d2a070;
  in_RDI[1].d.ptr = (char16_t *)&PTR__QAccessibleDial_00d2a0b8;
  QVar2 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffb8,(size_t)in_RDI);
  latin1.m_data = in_stack_ffffffffffffffe8;
  latin1.m_size = (qsizetype)in_stack_ffffffffffffffe0;
  QString::QString((QString *)QVar2.m_size,latin1);
  QAccessibleWidget::addControllingSignal(in_stack_ffffffffffffffe0,signal);
  QString::~QString((QString *)0x7ed37b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleDial::QAccessibleDial(QWidget *widget)
    : QAccessibleAbstractSlider(widget, QAccessible::Dial)
{
    Q_ASSERT(qobject_cast<QDial *>(widget));
    addControllingSignal("valueChanged(int)"_L1);
}